

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCustomAttributes.cpp
# Opt level: O2

void testCustomAttributes(string *tempDir)

{
  _Rb_tree_header *p_Var1;
  ostream *poVar2;
  char *pcVar3;
  Header *pHVar4;
  TypedAttribute<int> *pTVar5;
  OpaqueAttribute *pOVar6;
  TypedAttribute<Imf_3_4::Glorp> *pTVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  OutputFile out;
  undefined7 uStack_ef;
  FrameBuffer fb;
  Array2D<float> pf;
  Header hdr;
  string filename;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing custom attributes");
  std::endl<char,std::char_traits<char>>(poVar2);
  pf._sizeX = 0xc5;
  pf._sizeY = 0xd9;
  pf._data = (float *)operator_new__(0x29bf4);
  iVar11 = 0;
  pfVar8 = pf._data;
  for (uVar9 = 0; uVar9 != 0xc5; uVar9 = uVar9 + 1) {
    iVar12 = iVar11 + (int)((uVar9 & 0xffffffff) / 0x11) * -0xaa;
    uVar10 = 0;
    lVar13 = 0;
    while( true ) {
      if (lVar13 == 0x364) break;
      *(float *)((long)pfVar8 + lVar13) = (float)(iVar12 + (int)(uVar10 / 10) * -10);
      lVar13 = lVar13 + 4;
      iVar12 = iVar12 + 1;
      uVar10 = (ulong)((int)uVar10 + 1);
    }
    pfVar8 = pfVar8 + 0xd9;
    iVar11 = iVar11 + 10;
  }
  std::operator+(&filename,tempDir,"imf_test_custom_attr.exr");
  Imf_3_4::TypedAttribute<Imf_3_4::Glorp>::registerAttributeType();
  out = (OutputFile)0x0;
  uStack_ef = 0;
  Imf_3_4::Header::Header(&hdr,0xd9,0xc5,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  fb._map._M_t._M_impl._0_4_ = 0x19;
  Imf_3_4::TypedAttribute<int>::TypedAttribute((int *)&out);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"custom1");
  Imf_3_4::TypedAttribute<int>::~TypedAttribute((TypedAttribute<int> *)&out);
  fb._map._M_t._M_impl._0_8_ = 0x900000004;
  Imf_3_4::TypedAttribute<Imf_3_4::Glorp>::TypedAttribute
            ((TypedAttribute<Imf_3_4::Glorp> *)&out,(Glorp *)&fb);
  Imf_3_4::Header::insert((char *)&hdr,(Attribute *)"custom2");
  Imf_3_4::Attribute::~Attribute((Attribute *)&out);
  pcVar3 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::Channel::Channel((Channel *)&out,FLOAT,1,1,false);
  Imf_3_4::ChannelList::insert(pcVar3,(Channel *)0x1a5fb2);
  p_Var1 = &fb._map._M_t._M_impl.super__Rb_tree_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)pf._data,4,0x364,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5fb2);
  std::operator<<((ostream *)&std::cout,"writing");
  std::ostream::flush();
  remove(filename._M_dataplus._M_p);
  iVar11 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile(&out,filename._M_dataplus._M_p,&hdr,iVar11);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
  Imf_3_4::OutputFile::writePixels((int)&out);
  Imf_3_4::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  Imf_3_4::Header::~Header(&hdr);
  Imf_3_4::TypedAttribute<Imf_3_4::Glorp>::unRegisterAttributeType();
  out = (OutputFile)0x0;
  uStack_ef = 0;
  Imf_3_4::Header::Header(&hdr,0x40,0x40,1.0,(Vec2 *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  std::operator<<((ostream *)&std::cout," reading");
  std::ostream::flush();
  iVar11 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&out,filename._M_dataplus._M_p,iVar11);
  pHVar4 = (Header *)Imf_3_4::InputFile::header();
  pTVar5 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<int>>(pHVar4,"custom1");
  pHVar4 = (Header *)Imf_3_4::InputFile::header();
  pOVar6 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::OpaqueAttribute>(pHVar4,"custom2");
  if ((pTVar5 == (TypedAttribute<int> *)0x0) || (*(int *)(pTVar5 + 8) != 0x19)) {
    __assert_fail("c1 != 0 && c1->value () == 25",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCustomAttributes.cpp"
                  ,0x9f,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  if (pOVar6 == (OpaqueAttribute *)0x0) {
    __assert_fail("c2 != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCustomAttributes.cpp"
                  ,0xa0,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  pHVar4 = (Header *)Imf_3_4::InputFile::header();
  Imf_3_4::Header::operator=(&hdr,pHVar4);
  Imf_3_4::InputFile::~InputFile((InputFile *)&out);
  Imf_3_4::TypedAttribute<Imf_3_4::Glorp>::registerAttributeType();
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  fb._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Imf_3_4::Slice::Slice((Slice *)&out,FLOAT,(char *)pf._data,4,0x364,1,1,0.0,false,false);
  Imf_3_4::FrameBuffer::insert((char *)&fb,(Slice *)0x1a5fb2);
  std::operator<<((ostream *)&std::cout," writing");
  std::ostream::flush();
  remove(filename._M_dataplus._M_p);
  iVar11 = Imf_3_4::globalThreadCount();
  Imf_3_4::OutputFile::OutputFile(&out,filename._M_dataplus._M_p,&hdr,iVar11);
  Imf_3_4::OutputFile::setFrameBuffer((FrameBuffer *)&out);
  Imf_3_4::OutputFile::writePixels((int)&out);
  Imf_3_4::OutputFile::~OutputFile(&out);
  std::
  _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
               *)&fb);
  std::operator<<((ostream *)&std::cout," reading");
  std::ostream::flush();
  iVar11 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&out,filename._M_dataplus._M_p,iVar11);
  pHVar4 = (Header *)Imf_3_4::InputFile::header();
  pTVar5 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<int>>(pHVar4,"custom1");
  pHVar4 = (Header *)Imf_3_4::InputFile::header();
  pTVar7 = Imf_3_4::Header::findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::Glorp>>
                     (pHVar4,"custom2");
  if ((pTVar5 != (TypedAttribute<int> *)0x0) && (*(int *)(pTVar5 + 8) == 0x19)) {
    if (((pTVar7 != (TypedAttribute<Imf_3_4::Glorp> *)0x0) && ((pTVar7->_value).a == 4)) &&
       ((pTVar7->_value).b == 9)) {
      Imf_3_4::InputFile::~InputFile((InputFile *)&out);
      remove(filename._M_dataplus._M_p);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      Imf_3_4::Header::~Header(&hdr);
      poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)&filename);
      Imf_3_4::Array2D<float>::~Array2D(&pf);
      return;
    }
    __assert_fail("c2 != 0 && c2->value ().a == 4 && c2->value ().b == 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCustomAttributes.cpp"
                  ,0xd9,
                  "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
                 );
  }
  __assert_fail("c1 != 0 && c1->value () == 25",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCustomAttributes.cpp"
                ,0xd8,
                "void (anonymous namespace)::writeReadCustomAttr(const Array2D<float> &, const char *, int, int)"
               );
}

Assistant:

void
testCustomAttributes (const std::string& tempDir)
{
    try
    {
        cout << "Testing custom attributes" << endl;

        const int W = 217;
        const int H = 197;

        Array2D<float> pf (H, W);
        fillPixels (pf, W, H);

        std::string filename = tempDir + "imf_test_custom_attr.exr";

        writeReadCustomAttr (pf, filename.c_str (), W, H);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}